

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O0

ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags,ImGuiWindow *outer_window)

{
  uint uVar1;
  bool bVar2;
  ImGuiWindow *window_for_settings;
  ImGuiWindow *outer_window_local;
  ImGuiTableFlags flags_local;
  
  flags_local = flags;
  if ((flags & 0xe000U) == 0) {
    bVar2 = true;
    if ((flags & 0x1000000U) == 0) {
      bVar2 = (outer_window->Flags & 0x40U) != 0;
    }
    uVar1 = 0x8000;
    if (bVar2) {
      uVar1 = 0x2000;
    }
    flags_local = uVar1 | flags;
  }
  if ((flags_local & 0xe000U) == 0x4000) {
    flags_local = flags_local | 0x40000;
  }
  if ((flags_local & 1U) != 0) {
    flags_local = flags_local | 0x200;
  }
  if ((flags_local & 0x3000000U) != 0) {
    flags_local = flags_local & 0xfffcffff;
  }
  if ((flags_local & 0x1000U) != 0) {
    flags_local = flags_local & 0xfffff7ff;
  }
  if ((flags_local & 0xfU) == 0) {
    flags_local = flags_local | 0x10;
  }
  if ((outer_window->RootWindow->Flags & 0x100U) != 0) {
    flags_local = flags_local | 0x10;
  }
  return flags_local;
}

Assistant:

inline ImGuiTableFlags TableFixFlags(ImGuiTableFlags flags, ImGuiWindow* outer_window)
{
    // Adjust flags: set default sizing policy
    if ((flags & ImGuiTableFlags_SizingMask_) == 0)
        flags |= ((flags & ImGuiTableFlags_ScrollX) || (outer_window->Flags & ImGuiWindowFlags_AlwaysAutoResize)) ? ImGuiTableFlags_SizingFixedFit : ImGuiTableFlags_SizingStretchSame;

    // Adjust flags: enable NoKeepColumnsVisible when using ImGuiTableFlags_SizingFixedSame
    if ((flags & ImGuiTableFlags_SizingMask_) == ImGuiTableFlags_SizingFixedSame)
        flags |= ImGuiTableFlags_NoKeepColumnsVisible;

    // Adjust flags: enforce borders when resizable
    if (flags & ImGuiTableFlags_Resizable)
        flags |= ImGuiTableFlags_BordersInnerV;

    // Adjust flags: disable NoHostExtendX/NoHostExtendY if we have any scrolling going on
    if (flags & (ImGuiTableFlags_ScrollX | ImGuiTableFlags_ScrollY))
        flags &= ~(ImGuiTableFlags_NoHostExtendX | ImGuiTableFlags_NoHostExtendY);

    // Adjust flags: NoBordersInBodyUntilResize takes priority over NoBordersInBody
    if (flags & ImGuiTableFlags_NoBordersInBodyUntilResize)
        flags &= ~ImGuiTableFlags_NoBordersInBody;

    // Adjust flags: disable saved settings if there's nothing to save
    if ((flags & (ImGuiTableFlags_Resizable | ImGuiTableFlags_Hideable | ImGuiTableFlags_Reorderable | ImGuiTableFlags_Sortable)) == 0)
        flags |= ImGuiTableFlags_NoSavedSettings;

    // Inherit _NoSavedSettings from top-level window (child windows always have _NoSavedSettings set)
#ifdef IMGUI_HAS_DOCK
    ImGuiWindow* window_for_settings = outer_window->RootWindowDockStop;
#else
    ImGuiWindow* window_for_settings = outer_window->RootWindow;
#endif
    if (window_for_settings->Flags & ImGuiWindowFlags_NoSavedSettings)
        flags |= ImGuiTableFlags_NoSavedSettings;

    return flags;
}